

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcCompositeProfileDef::~IfcCompositeProfileDef
          (IfcCompositeProfileDef *this)

{
  undefined1 *puVar1;
  void *pvVar2;
  size_type *psVar3;
  
  *(undefined8 *)&this[-1].super_IfcProfileDef.field_0x68 = 0x86ba88;
  *(undefined8 *)&(this->super_IfcProfileDef).ProfileName.have = 0x86bad8;
  (this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x86bab0;
  puVar1 = *(undefined1 **)&(this->super_IfcProfileDef).field_0x28;
  psVar3 = &(this->super_IfcProfileDef).ProfileName.ptr._M_string_length;
  if ((size_type *)puVar1 != psVar3) {
    operator_delete(puVar1,*psVar3 + 1);
  }
  pvVar2 = *(void **)&(this->super_IfcProfileDef).
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x10;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,*(long *)&(this->super_IfcProfileDef).
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>
                                     .field_0x20 - (long)pvVar2);
  }
  *(undefined8 *)&this[-1].super_IfcProfileDef.field_0x68 = 0x86bb00;
  *(undefined8 *)&(this->super_IfcProfileDef).ProfileName.have = 0x86bb28;
  puVar1 = *(undefined1 **)((long)&this[-1].Label.ptr.field_2 + 8);
  if (puVar1 != &this[-1].field_0xa8) {
    operator_delete(puVar1,*(long *)&this[-1].field_0xa8 + 1);
  }
  psVar3 = &this[-1].Label.ptr._M_string_length;
  if ((size_type *)*(undefined1 **)&this[-1].field_0x78 != psVar3) {
    operator_delete(*(undefined1 **)&this[-1].field_0x78,*psVar3 + 1);
  }
  operator_delete(&this[-1].super_IfcProfileDef.field_0x68,0xc0);
  return;
}

Assistant:

IfcCompositeProfileDef() : Object("IfcCompositeProfileDef") {}